

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  bool bVar1;
  long *in_RSI;
  bool local_61;
  MutexLock local_38;
  MutexLock l;
  WriteOptions local_1a;
  undefined1 local_19;
  DBImpl *this_local;
  Status *s;
  
  local_19 = 0;
  local_1a.sync = false;
  this_local = this;
  WriteOptions::WriteOptions(&local_1a);
  (**(code **)(*in_RSI + 0x20))(this,in_RSI,&local_1a,0);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    MutexLock::MutexLock(&local_38,(Mutex *)(in_RSI + 0x19));
    while( true ) {
      local_61 = false;
      if (in_RSI[0x27] != 0) {
        local_61 = Status::ok((Status *)(in_RSI + 0x46));
      }
      if (local_61 == false) break;
      port::CondVar::Wait((CondVar *)(in_RSI + 0x1f));
    }
    if (in_RSI[0x27] != 0) {
      Status::operator=((Status *)this,(Status *)(in_RSI + 0x46));
    }
    MutexLock::~MutexLock(&local_38);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}